

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsValidBaseImage(Instruction *this)

{
  uint32_t id;
  Op OVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  undefined1 local_31;
  Instruction *type;
  uint32_t tid;
  Instruction *this_local;
  
  id = type_id(this);
  if (id == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = context(this);
    this_01 = IRContext::get_def_use_mgr(this_00);
    this_02 = analysis::DefUseManager::GetDef(this_01,id);
    OVar1 = opcode(this_02);
    local_31 = true;
    if (OVar1 != OpTypeImage) {
      OVar1 = opcode(this_02);
      local_31 = OVar1 == OpTypeSampledImage;
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsValidBaseImage() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  return (type->opcode() == spv::Op::OpTypeImage ||
          type->opcode() == spv::Op::OpTypeSampledImage);
}